

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpListVariables(cmDocumentation *this,ostream *os)

{
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmDocumentation *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"variable/*",&local_39);
  PrintNames(this,os,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return true;
}

Assistant:

bool cmDocumentation::PrintHelpListVariables(std::ostream& os)
{
  this->PrintNames(os, "variable/*");
  return true;
}